

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O0

int32_t strcmpAfterPrefix(char *s1,char *s2,int32_t *pPrefixLength)

{
  int iVar1;
  int32_t c2;
  int32_t c1;
  int32_t cmp;
  int32_t pl;
  int32_t *pPrefixLength_local;
  char *s2_local;
  char *s1_local;
  
  c1 = *pPrefixLength;
  pPrefixLength_local = (int32_t *)(s2 + c1);
  s2_local = s1 + c1;
  while( true ) {
    iVar1 = (uint)(byte)*s2_local - (uint)(byte)*pPrefixLength_local;
    if ((iVar1 != 0) || ((byte)*s2_local == 0)) break;
    c1 = c1 + 1;
    pPrefixLength_local = (int32_t *)((long)pPrefixLength_local + 1);
    s2_local = s2_local + 1;
  }
  *pPrefixLength = c1;
  return iVar1;
}

Assistant:

static int32_t
strcmpAfterPrefix(const char *s1, const char *s2, int32_t *pPrefixLength) {
    int32_t pl=*pPrefixLength;
    int32_t cmp=0;
    s1+=pl;
    s2+=pl;
    for(;;) {
        int32_t c1=(uint8_t)*s1++;
        int32_t c2=(uint8_t)*s2++;
        cmp=c1-c2;
        if(cmp!=0 || c1==0) {  /* different or done */
            break;
        }
        ++pl;  /* increment shared same-prefix length */
    }
    *pPrefixLength=pl;
    return cmp;
}